

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# User.cpp
# Opt level: O0

string * __thiscall
SHOPManagement::User::getUserPass_abi_cxx11_(string *__return_storage_ptr__,User *this)

{
  User *this_local;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_user_pass);
  return __return_storage_ptr__;
}

Assistant:

std::string User::getUserPass() const
    {
        return this->m_user_pass;
    }